

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::UnaryOperatorWrapper,duckdb::NegateOperator>
               (hugeint_t *ldata,hugeint_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  sel_t *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ulong uVar5;
  TemplatedValidityData<unsigned_long> *pTVar6;
  _Head_base<0UL,_unsigned_long_*,_false> _Var7;
  idx_t iVar8;
  idx_t idx_in_entry;
  ulong uVar9;
  int64_t *piVar10;
  hugeint_t hVar11;
  hugeint_t input;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_48;
  ValidityMask *local_40;
  idx_t local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar1 = sel_vector->sel_vector;
      piVar10 = &result_data->upper;
      uVar9 = 0;
      iVar8 = count;
      do {
        uVar5 = uVar9;
        if (psVar1 != (sel_t *)0x0) {
          uVar5 = (ulong)psVar1[uVar9];
        }
        hVar11.upper = iVar8;
        hVar11.lower = ldata[uVar5].upper;
        hVar11 = NegateOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>
                           ((NegateOperator *)ldata[uVar5].lower,hVar11);
        iVar8 = hVar11.upper;
        ((hugeint_t *)(piVar10 + -1))->lower = hVar11.lower;
        *piVar10 = iVar8;
        uVar9 = uVar9 + 1;
        piVar10 = piVar10 + 2;
      } while (count != uVar9);
    }
  }
  else if (count != 0) {
    psVar1 = sel_vector->sel_vector;
    local_48 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    piVar10 = &result_data->upper;
    uVar9 = 0;
    local_40 = mask;
    do {
      uVar5 = uVar9;
      if (psVar1 != (sel_t *)0x0) {
        uVar5 = (ulong)psVar1[uVar9];
      }
      input.upper = uVar5 >> 6;
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[input.upper] >>
           (uVar5 & 0x3f) & 1) == 0) {
        _Var7._M_head_impl = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask
        ;
        if (_Var7._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var4 = p_Stack_50;
          peVar3 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar3;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var4;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar6 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_48);
          _Var7._M_head_impl =
               (pTVar6->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var7._M_head_impl;
          mask = local_40;
        }
        bVar2 = (byte)uVar9 & 0x3f;
        _Var7._M_head_impl[uVar9 >> 6] =
             _Var7._M_head_impl[uVar9 >> 6] & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
      }
      else {
        input.lower = ldata[uVar5].upper;
        hVar11 = NegateOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>
                           ((NegateOperator *)ldata[uVar5].lower,input);
        ((hugeint_t *)(piVar10 + -1))->lower = hVar11.lower;
        *piVar10 = hVar11.upper;
      }
      uVar9 = uVar9 + 1;
      piVar10 = piVar10 + 2;
    } while (count != uVar9);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}